

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_wString __thiscall
ON_SubD::VertexTagToString(ON_SubD *this,ON_SubDVertexTag vertex_tag,bool bVerbose)

{
  wchar_t *s;
  
  if (vertex_tag < (Dart|Smooth)) {
    s = *(wchar_t **)(&DAT_00828b80 + (ulong)vertex_tag * 8);
  }
  else {
    s = L"invalid";
  }
  if (bVerbose) {
    ON_wString::FormatToString((wchar_t *)this,L"ON_SubDVertexTag::%ls");
  }
  else {
    ON_wString::ON_wString((ON_wString *)this,s);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubD::VertexTagToString(
  ON_SubDVertexTag vertex_tag,
  bool bVerbose
)
{
  const wchar_t* tag_name;
  switch (vertex_tag)
  {
  case ON_SubDVertexTag::Unset:
    tag_name = L"Unset";
    break;
  case ON_SubDVertexTag::Smooth:
    tag_name = L"Smooth";
    break;
  case ON_SubDVertexTag::Crease:
    tag_name = L"Crease";
    break;
  case ON_SubDVertexTag::Corner:
    tag_name = L"Corner";
    break;
  case ON_SubDVertexTag::Dart:
    tag_name = L"Dart";
    break;
  default:
    tag_name = L"invalid";
    break;
  }
  return bVerbose ? ON_wString::FormatToString(L"ON_SubDVertexTag::%ls", tag_name) : ON_wString(tag_name);
}